

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O3

void stripctrl_term_put_wc(StripCtrlCharsImpl *scc,unsigned_long wc)

{
  wchar_t ucs;
  uint uVar1;
  uint uVar2;
  undefined8 in_RAX;
  ulong uVar3;
  size_t len;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ptrlen pl;
  ptrlen pl_00;
  ptrlen pl_01;
  char outbuf [6];
  undefined8 uStack_38;
  
  uVar2 = (uint)wc;
  uStack_38 = in_RAX;
  if (scc->term->cjk_ambig_wide == true) {
    uVar1 = mk_wcwidth_cjk(uVar2);
  }
  else {
    uVar1 = mk_wcwidth(uVar2);
  }
  if ((int)uVar1 < 0 || (wc & 0xffffffffffffff60) == 0) {
    if ((uVar2 == 10) || ((uVar2 == 0xd && (scc->permit_cr != false)))) {
      uVar2 = 0;
      if (0 < (int)uVar1) {
        uVar2 = uVar1;
      }
    }
    else {
      ucs = scc->substitution;
      wc = (unsigned_long)ucs;
      if (wc == 0) {
        return;
      }
      if (scc->term->cjk_ambig_wide == true) {
        uVar2 = mk_wcwidth_cjk(ucs);
      }
      else {
        uVar2 = mk_wcwidth(ucs);
      }
      if ((int)uVar2 < 0) {
        __assert_fail("width >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                      ,199,"void stripctrl_term_put_wc(StripCtrlCharsImpl *, unsigned long)");
      }
    }
    uVar4 = (ulong)(wc == 10);
    pcVar5 = "";
    if (wc == 10) {
      pcVar5 = "\r";
    }
  }
  else {
    pcVar5 = "";
    uVar4 = 0;
    uVar2 = uVar1;
  }
  if (scc->line_limit == true) {
    if (scc->line_start == true) {
      pl.len = 2;
      pl.ptr = "| ";
      BinarySink_put_datapl(scc->bs_out->binarysink_,pl);
      scc->line_start = false;
      scc->line_chars_remaining = 0x4d;
    }
    if ((int)wc == 10) {
      scc->line_start = true;
    }
    else {
      uVar6 = (ulong)uVar2;
      uVar3 = scc->line_chars_remaining;
      if (uVar3 < uVar6) {
        pl_00.len = 4;
        pl_00.ptr = "\r\n> ";
        BinarySink_put_datapl(scc->bs_out->binarysink_,pl_00);
        scc->line_chars_remaining = 0x4d;
        uVar3 = 0x4d;
      }
      if (uVar3 < uVar6) {
        __assert_fail("width <= scc->line_chars_remaining",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                      ,0x9c,"void stripctrl_check_line_limit(StripCtrlCharsImpl *, wchar_t, size_t)"
                     );
      }
      scc->line_chars_remaining = uVar3 - uVar6;
    }
  }
  if (uVar4 != 0) {
    pl_01.len = uVar4;
    pl_01.ptr = pcVar5;
    BinarySink_put_datapl(scc->bs_out->binarysink_,pl_01);
  }
  uVar4 = wc & 0xff;
  if ((wc & 0xfffffffffffff800) != 0xd800) {
    uVar4 = wc;
  }
  if ((scc->term->utf == false) && (scc->term->ucsdata->line_codepage != L'7')) {
    uStack_38._0_3_ = CONCAT12((char)uVar4,(undefined2)uStack_38);
    len = 1;
  }
  else {
    len = encode_utf8((void *)((long)&uStack_38 + 2),uVar4);
    if (len == 0) {
      return;
    }
  }
  BinarySink_put_data(scc->bs_out->binarysink_,(void *)((long)&uStack_38 + 2),len);
  return;
}

Assistant:

static inline void stripctrl_term_put_wc(
    StripCtrlCharsImpl *scc, unsigned long wc)
{
    ptrlen prefix = PTRLEN_LITERAL("");
    int width = term_char_width(scc->term, wc);

    if (!(wc & ~0x9F) || width < 0) {
        /* This is something the terminal interprets as a control
         * character. */
        if (!stripctrl_ctrlchar_ok(scc, wc)) {
            if (!scc->substitution) {
                return;
            } else {
                wc = scc->substitution;
                width = term_char_width(scc->term, wc);
                assert(width >= 0);
            }
        } else {
            if (width < 0)
                width = 0; /* sanitise for stripctrl_check_line_limit */
        }

        if (wc == '\012') {
            /* Precede \n with \r, because our terminal will not
             * generally be in the ONLCR mode where it assumes that
             * internally, and any \r on input has been stripped
             * out. */
            prefix = PTRLEN_LITERAL("\r");
        }
    }

    stripctrl_check_line_limit(scc, wc, width);

    if (prefix.len)
        put_datapl(scc->bs_out, prefix);

    char outbuf[6];
    size_t produced;

    /*
     * The Terminal implementation encodes 7-bit ASCII characters in
     * UTF-8 mode, and all printing characters in non-UTF-8 (i.e.
     * single-byte character set) mode, as values in the surrogate
     * range (a conveniently unused piece of space in this context)
     * whose low byte is the original 1-byte representation of the
     * character.
     */
    if ((wc - 0xD800) < (0xE000 - 0xD800))
        wc &= 0xFF;

    if (in_utf(scc->term)) {
        produced = encode_utf8(outbuf, wc);
    } else {
        outbuf[0] = wc;
        produced = 1;
    }

    if (produced > 0)
        put_data(scc->bs_out, outbuf, produced);
}